

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O3

void moira::sprintx(char **s,u64 value,DasmNumberFormat *fmt,int digits)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  char cVar4;
  char cVar5;
  uint uVar6;
  long lVar7;
  
  bVar1 = fmt->upperCase;
  if (((value != 0) || (fmt->plainZero == false)) && (cVar4 = *fmt->prefix, cVar4 != '\0')) {
    lVar7 = 1;
    do {
      pcVar2 = *s;
      *s = pcVar2 + 1;
      *pcVar2 = cVar4;
      cVar4 = fmt->prefix[lVar7];
      lVar7 = lVar7 + 1;
    } while (cVar4 != '\0');
  }
  if (0 < digits) {
    uVar3 = (ulong)(uint)digits + 1;
    do {
      uVar6 = (uint)value & 0xf;
      cVar4 = (char)uVar6;
      cVar5 = cVar4 + '0';
      if (9 < uVar6) {
        cVar5 = cVar4 + (bVar1 ^ 1U) * ' ' + '7';
      }
      (*s)[uVar3 - 2] = cVar5;
      value = value >> 4;
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
  }
  *s = *s + digits;
  return;
}

Assistant:

static void sprintx(char *&s, u64 value, const DasmNumberFormat &fmt, int digits)
{
    char a = (fmt.upperCase ? 'A' : 'a') - 10;

    if (value || !fmt.plainZero) {

        for (int i = 0; fmt.prefix[i]; i++) *s++ = fmt.prefix[i];
    }
    for (int i = digits - 1; i >= 0; i--) {

        auto digit = char(value % 16);
        s[i] = (digit <= 9) ? ('0' + digit) : (a + digit);
        value /= 16;
    }
    s += digits;
}